

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

bool ImGui::ImageButtonEx
               (ImGuiID id,ImTextureID texture_id,ImVec2 *size,ImVec2 *uv0,ImVec2 *uv1,
               ImVec4 *bg_col,ImVec4 *tint_col)

{
  ImGuiWindow *pIVar1;
  ImDrawList *pIVar2;
  ImVec2 p_min;
  ImVec2 p_max;
  ImGuiContext *pIVar3;
  bool bVar4;
  bool bVar5;
  ImU32 IVar6;
  ImGuiCol idx;
  ImGuiContext *g;
  float fVar7;
  float fVar8;
  bool hovered;
  bool held;
  ImRect bb;
  bool local_82;
  bool local_81;
  ImRect local_80;
  ImVec2 local_70;
  ImVec2 local_68;
  undefined8 uStack_60;
  ImVec2 *local_58;
  ImVec4 *local_50;
  ImTextureID local_48;
  ImVec2 *local_40;
  ImVec2 local_38;
  
  pIVar3 = GImGui;
  GImGui->CurrentWindow->WriteAccessed = true;
  pIVar1 = pIVar3->CurrentWindow;
  if (pIVar1->SkipItems == false) {
    local_68 = (pIVar3->Style).FramePadding;
    local_80.Min.x = (pIVar1->DC).CursorPos.x;
    local_80.Min.y = (pIVar1->DC).CursorPos.y;
    uStack_60 = 0;
    local_80.Max.x = local_68.x + local_68.x + (*size).x + local_80.Min.x;
    local_80.Max.y = local_68.y + local_68.y + (*size).y + local_80.Min.y;
    local_70.y = local_80.Max.y - local_80.Min.y;
    local_70.x = local_80.Max.x - local_80.Min.x;
    local_50 = bg_col;
    local_48 = texture_id;
    local_40 = uv0;
    ItemSize(&local_70,-1.0);
    bVar5 = false;
    bVar4 = ItemAdd(&local_80,id,(ImRect *)0x0,0);
    if (bVar4) {
      local_58 = uv1;
      bVar5 = ButtonBehavior(&local_80,id,&local_82,&local_81,0);
      if ((local_81 != true) || (idx = 0x17, local_82 == false)) {
        idx = local_82 + 0x15;
      }
      IVar6 = GetColorU32(idx,1.0);
      RenderNavHighlight(&local_80,id,1);
      p_min.y = local_80.Min.y;
      p_min.x = local_80.Min.x;
      p_max.y = local_80.Max.y;
      p_max.x = local_80.Max.x;
      fVar7 = local_68.x;
      if (local_68.y <= local_68.x) {
        fVar7 = local_68.y;
      }
      fVar8 = (pIVar3->Style).FrameRounding;
      if (fVar7 <= fVar8) {
        fVar8 = fVar7;
      }
      RenderFrame(p_min,p_max,IVar6,true,(float)(~-(uint)(fVar7 < 0.0) & (uint)fVar8));
      if (0.0 < local_50->w) {
        pIVar2 = pIVar1->DrawList;
        local_70.x = local_80.Min.x + local_68.x;
        local_70.y = local_80.Min.y + local_68.y;
        local_38.y = local_80.Max.y - local_68.y;
        local_38.x = local_80.Max.x - local_68.x;
        IVar6 = GetColorU32(local_50);
        ImDrawList::AddRectFilled(pIVar2,&local_70,&local_38,IVar6,0.0,0);
      }
      pIVar2 = pIVar1->DrawList;
      local_70.x = local_80.Min.x + local_68.x;
      local_70.y = local_80.Min.y + local_68.y;
      local_38.y = local_80.Max.y - local_68.y;
      local_38.x = local_80.Max.x - local_68.x;
      IVar6 = GetColorU32(tint_col);
      ImDrawList::AddImage(pIVar2,local_48,&local_70,&local_38,local_40,local_58,IVar6);
    }
  }
  else {
    bVar5 = false;
  }
  return bVar5;
}

Assistant:

bool ImGui::ImageButtonEx(ImGuiID id, ImTextureID texture_id, const ImVec2& size, const ImVec2& uv0, const ImVec2& uv1, const ImVec4& bg_col, const ImVec4& tint_col)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    const ImVec2 padding = g.Style.FramePadding;
    const ImRect bb(window->DC.CursorPos, window->DC.CursorPos + size + padding * 2.0f);
    ItemSize(bb);
    if (!ItemAdd(bb, id))
        return false;

    bool hovered, held;
    bool pressed = ButtonBehavior(bb, id, &hovered, &held);

    // Render
    const ImU32 col = GetColorU32((held && hovered) ? ImGuiCol_ButtonActive : hovered ? ImGuiCol_ButtonHovered : ImGuiCol_Button);
    RenderNavHighlight(bb, id);
    RenderFrame(bb.Min, bb.Max, col, true, ImClamp((float)ImMin(padding.x, padding.y), 0.0f, g.Style.FrameRounding));
    if (bg_col.w > 0.0f)
        window->DrawList->AddRectFilled(bb.Min + padding, bb.Max - padding, GetColorU32(bg_col));
    window->DrawList->AddImage(texture_id, bb.Min + padding, bb.Max - padding, uv0, uv1, GetColorU32(tint_col));

    return pressed;
}